

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IdleDecommitPageAllocator.cpp
# Opt level: O0

void __thiscall
Memory::IdleDecommitPageAllocator::Prime(IdleDecommitPageAllocator *this,uint primePageCount)

{
  PageSegmentBase<Memory::VirtualAllocWrapper> *this_00;
  PageSegment *segment;
  uint primePageCount_local;
  IdleDecommitPageAllocator *this_local;
  
  while (((this->super_PageAllocator).freePageCount < (ulong)primePageCount &&
         (this_00 = PageAllocatorBase<Memory::VirtualAllocWrapper,_Memory::SegmentBase<Memory::VirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>
                    ::AddPageSegment(&this->super_PageAllocator,
                                     &(this->super_PageAllocator).emptySegments),
         this_00 != (PageSegmentBase<Memory::VirtualAllocWrapper> *)0x0))) {
    PageSegmentBase<Memory::VirtualAllocWrapper>::Prime(this_00);
  }
  return;
}

Assistant:

void
IdleDecommitPageAllocator::Prime(uint primePageCount)
{
    while (this->freePageCount < primePageCount)
    {
        PageSegment * segment = AddPageSegment(emptySegments);
        if (segment == nullptr)
        {
            return;
        }
        segment->Prime();
    }
}